

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMerge.c
# Opt level: O3

void Abc_NtkCollectCircle(Vec_Ptr_t *vStart,Vec_Ptr_t *vNext,int nFanMax)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  void **ppvVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  long lVar11;
  
  uVar10 = (ulong)(uint)nFanMax;
  vNext->nSize = 0;
  if (0 < vStart->nSize) {
    lVar8 = 0;
    do {
      plVar3 = (long *)vStart->pArray[lVar8];
      if (0 < *(int *)((long)plVar3 + 0x1c)) {
        lVar11 = 0;
        do {
          plVar4 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                             (long)*(int *)(plVar3[4] + lVar11 * 4) * 8);
          if ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 7) {
            lVar5 = *plVar4;
            iVar2 = (int)plVar4[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar2 + 1,(int)uVar10);
            if (((long)iVar2 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar2)) goto LAB_002d39d3;
            lVar6 = *plVar4;
            iVar1 = *(int *)(lVar6 + 0xd8);
            uVar10 = extraout_RDX;
            if (*(int *)(*(long *)(lVar5 + 0xe8) + (long)iVar2 * 4) != iVar1) {
              iVar2 = (int)plVar4[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar6 + 0xe0),iVar2 + 1,(int)extraout_RDX);
              if (((long)iVar2 < 0) || (*(int *)(lVar6 + 0xe4) <= iVar2)) goto LAB_002d39f2;
              *(int *)(*(long *)(lVar6 + 0xe8) + (long)iVar2 * 4) = iVar1;
              uVar9 = vNext->nSize;
              if (uVar9 == vNext->nCap) {
                if ((int)uVar9 < 0x10) {
                  if (vNext->pArray == (void **)0x0) {
                    ppvVar7 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar7 = (void **)realloc(vNext->pArray,0x80);
                  }
                  vNext->pArray = ppvVar7;
                  vNext->nCap = 0x10;
                }
                else {
                  if (vNext->pArray == (void **)0x0) {
                    ppvVar7 = (void **)malloc((ulong)uVar9 << 4);
                  }
                  else {
                    ppvVar7 = (void **)realloc(vNext->pArray,(ulong)uVar9 << 4);
                  }
                  vNext->pArray = ppvVar7;
                  vNext->nCap = uVar9 * 2;
                }
              }
              else {
                ppvVar7 = vNext->pArray;
              }
              iVar2 = vNext->nSize;
              uVar9 = iVar2 + 1;
              uVar10 = (ulong)uVar9;
              vNext->nSize = uVar9;
              ppvVar7[iVar2] = plVar4;
            }
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < *(int *)((long)plVar3 + 0x1c));
      }
      if (0 < *(int *)((long)plVar3 + 0x2c)) {
        lVar11 = 0;
        do {
          plVar4 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                             (long)*(int *)(plVar3[6] + lVar11 * 4) * 8);
          if ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 7) {
            lVar5 = *plVar4;
            iVar2 = (int)plVar4[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar2 + 1,(int)uVar10);
            if (((long)iVar2 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar2)) {
LAB_002d39d3:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            lVar6 = *plVar4;
            iVar1 = *(int *)(lVar6 + 0xd8);
            uVar10 = extraout_RDX_00;
            if (*(int *)(*(long *)(lVar5 + 0xe8) + (long)iVar2 * 4) != iVar1) {
              iVar2 = (int)plVar4[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar6 + 0xe0),iVar2 + 1,(int)extraout_RDX_00);
              if (((long)iVar2 < 0) || (*(int *)(lVar6 + 0xe4) <= iVar2)) {
LAB_002d39f2:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                              ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              *(int *)(*(long *)(lVar6 + 0xe8) + (long)iVar2 * 4) = iVar1;
              uVar10 = extraout_RDX_01;
              if (*(int *)((long)plVar4 + 0x2c) <= nFanMax) {
                uVar9 = vNext->nSize;
                if (uVar9 == vNext->nCap) {
                  if ((int)uVar9 < 0x10) {
                    if (vNext->pArray == (void **)0x0) {
                      ppvVar7 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar7 = (void **)realloc(vNext->pArray,0x80);
                    }
                    vNext->pArray = ppvVar7;
                    vNext->nCap = 0x10;
                  }
                  else {
                    if (vNext->pArray == (void **)0x0) {
                      ppvVar7 = (void **)malloc((ulong)uVar9 << 4);
                    }
                    else {
                      ppvVar7 = (void **)realloc(vNext->pArray,(ulong)uVar9 << 4);
                    }
                    vNext->pArray = ppvVar7;
                    vNext->nCap = uVar9 * 2;
                  }
                }
                else {
                  ppvVar7 = vNext->pArray;
                }
                iVar2 = vNext->nSize;
                uVar9 = iVar2 + 1;
                uVar10 = (ulong)uVar9;
                vNext->nSize = uVar9;
                ppvVar7[iVar2] = plVar4;
              }
            }
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < *(int *)((long)plVar3 + 0x2c));
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < vStart->nSize);
  }
  return;
}

Assistant:

void Abc_NtkCollectCircle( Vec_Ptr_t * vStart, Vec_Ptr_t * vNext, int nFanMax )
{
    Abc_Obj_t * pObj, * pNext;
    int i, k;
    Vec_PtrClear( vNext );
    Vec_PtrForEachEntry( Abc_Obj_t *, vStart, pObj, i )
    {
        Abc_ObjForEachFanin( pObj, pNext, k )
        {
            if ( !Abc_ObjIsNode(pNext) )
                continue;
            if ( Abc_NodeIsTravIdCurrent( pNext ) )
                continue;
            Abc_NodeSetTravIdCurrent( pNext );
            Vec_PtrPush( vNext, pNext );
        }
        Abc_ObjForEachFanout( pObj, pNext, k )
        {
            if ( !Abc_ObjIsNode(pNext) )
                continue;
            if ( Abc_NodeIsTravIdCurrent( pNext ) )
                continue;
            Abc_NodeSetTravIdCurrent( pNext );
            if ( Abc_ObjFanoutNum(pNext) > nFanMax )
                continue;
            Vec_PtrPush( vNext, pNext );
        }
    }
}